

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int * __thiscall ImGuiStorage::GetIntRef(ImGuiStorage *this,ImGuiID key,int default_val)

{
  int *piVar1;
  uint uVar2;
  Pair *pPVar3;
  ImGuiContext *pIVar4;
  Pair *pPVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  pIVar4 = GImGui;
  pPVar3 = (this->Data).Data;
  uVar2 = (this->Data).Size;
  pPVar5 = pPVar3;
  uVar10 = uVar2;
  if (0 < (long)(int)uVar2) {
    do {
      uVar6 = uVar10 >> 1;
      uVar11 = uVar6;
      if (pPVar5[uVar6].key < key) {
        uVar11 = uVar10 + ~uVar6;
        pPVar5 = pPVar5 + (ulong)uVar6 + 1;
      }
      uVar10 = uVar11;
    } while (0 < (int)uVar11);
  }
  if ((pPVar5 == pPVar3 + (int)uVar2) || (pPVar5->key != key)) {
    if ((pPVar5 < pPVar3) || (pPVar3 + (int)uVar2 < pPVar5)) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                    ,0x3ab,
                    "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
                   );
    }
    lVar9 = (long)pPVar5 - (long)pPVar3;
    uVar10 = (this->Data).Capacity;
    if (uVar2 == uVar10) {
      iVar12 = 4;
      if (uVar10 != 0) {
        iVar12 = uVar10 * 2;
      }
      if ((int)uVar10 < iVar12) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pPVar5 = (Pair *)(*(pIVar4->IO).MemAllocFn)((long)iVar12 << 4);
        pPVar3 = (this->Data).Data;
        if (pPVar3 != (Pair *)0x0) {
          memcpy(pPVar5,pPVar3,(long)(this->Data).Size << 4);
        }
        pPVar3 = (this->Data).Data;
        if (pPVar3 != (Pair *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pPVar3);
        (this->Data).Data = pPVar5;
        (this->Data).Capacity = iVar12;
      }
    }
    lVar7 = (long)(this->Data).Size;
    lVar8 = lVar7 - (lVar9 >> 4);
    if (lVar8 != 0 && lVar9 >> 4 <= lVar7) {
      pPVar3 = (this->Data).Data;
      memmove((void *)((long)pPVar3 + lVar9 + 0x10),(void *)((long)pPVar3 + lVar9),lVar8 * 0x10);
    }
    pPVar3 = (this->Data).Data;
    *(ImGuiID *)((long)pPVar3 + lVar9) = key;
    *(int *)((long)pPVar3 + lVar9 + 8) = default_val;
    (this->Data).Size = (this->Data).Size + 1;
    pPVar5 = (Pair *)(lVar9 + (long)(this->Data).Data);
  }
  return (int *)&pPVar5->field_1;
}

Assistant:

int* ImGuiStorage::GetIntRef(ImGuiID key, int default_val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_i;
}